

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O2

string_view __thiscall jhu::thrax::SAMTLabeler::operator()(SAMTLabeler *this,SpanPair nt)

{
  Tree *tree;
  string *this_00;
  ushort uVar1;
  pointer pNVar2;
  Node *pNVar3;
  __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
  __position;
  __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
  _Var4;
  iterator iVar5;
  pointer pcVar6;
  pointer pNVar7;
  Node *pNVar8;
  Span nt_00;
  size_type sVar9;
  pair<__gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>,___gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>_>
  pVar10;
  pair<__gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>,___gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>_>
  pVar11;
  string_view sVar12;
  long lStack_100;
  MaybeLabel arg;
  undefined1 local_c8;
  optional<jhu::thrax::(anonymous_namespace)::Constituent> label;
  bool local_78;
  __visit_result_t<jhu::thrax::(anonymous_namespace)::LabelVisitor,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_>
  result;
  
  nt_00 = nt.tgt;
  (this->key_).span = nt_00;
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<jhu::thrax::CachedLabel*,std::vector<jhu::thrax::CachedLabel,std::allocator<jhu::thrax::CachedLabel>>>,jhu::thrax::CachedLabel,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(jhu::thrax::CachedLabel_const&,jhu::thrax::CachedLabel_const&)>>
                         ((this->cache_).
                          super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->cache_).
                          super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&this->key_,
                          (_Iter_comp_val<bool_(*)(const_jhu::thrax::CachedLabel_&,_const_jhu::thrax::CachedLabel_&)>
                           )0x136b15);
  if (((__position._M_current ==
        (this->cache_).
        super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>.
        _M_impl.super__Vector_impl_data._M_finish) ||
      (nt.tgt.start != ((__position._M_current)->span).start)) ||
     ((int)nt_00 >> 0x10 != (int)((__position._M_current)->span).end)) {
    tree = &this->tree_;
    anon_unknown_0::constituent(&label,tree,nt_00);
    if (label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
        _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
        _M_engaged == true) {
      arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len =
           label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
           _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
           _M_payload._M_value.label._M_len;
      arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str =
           label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
           _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
           _M_payload._M_value.label._M_str;
      lStack_100 = 0;
    }
    else {
      pNVar7 = (this->tree_).super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar2 = (this->tree_).super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pNVar7 != pNVar2) {
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._0_2_ = nt_00.start;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._2_2_ = nt_00.end;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = (char *)0x0;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged = false;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._17_7_
             = 0;
        pVar10 = std::
                 equal_range<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,jhu::thrax::(anonymous_namespace)::__1>
                           (pNVar7,pNVar2,&arg);
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len._2_2_ = 0;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len._0_2_ = nt.tgt.end;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = (char *)0x0;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged = false;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._17_7_
             = 0;
        pVar11 = std::
                 equal_range<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,jhu::thrax::(anonymous_namespace)::__1>
                           (pNVar7,pNVar2,&arg);
        _Var4._M_current = pVar10.second._M_current._M_current;
        while (pNVar8 = _Var4._M_current, _Var4._M_current = pVar11.second._M_current._M_current,
              pVar10.first._M_current._M_current <= pNVar8 + -1) {
          while (pNVar3 = _Var4._M_current, _Var4._M_current = pNVar8 + -1,
                pVar11.first._M_current._M_current <= pNVar3 + -1) {
            _Var4._M_current = pNVar3 + -1;
            if (pNVar8[-1].span.end == pNVar3[-1].span.end) {
              label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
              ._M_payload.
              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
              _M_payload._M_value.label._M_len = pNVar8[-1].label._M_len;
              arg.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_str = pNVar8[-1].label._M_str;
              arg.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _16_8_ = pNVar3[-1].label._M_len;
              lStack_100 = 1;
              arg.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_len =
                   label.
                   super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
                   _M_payload.
                   super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
                   _M_payload._M_value.label._M_len;
              label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
              ._M_payload.
              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
              _M_payload._M_value.label._M_str =
                   arg.
                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                   ._M_payload._M_value._M_str;
              label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
              ._M_payload.
              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>._16_8_ =
                   arg.
                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                   ._16_8_;
              goto LAB_00136a72;
            }
          }
        }
      }
      for (; (pNVar7 != pNVar2 && (uVar1 = (pNVar7->span).start, (short)uVar1 < nt.tgt.start));
          pNVar7 = pNVar7 + 1) {
        if ((int)nt_00 >> 0x10 == (int)(pNVar7->span).end) {
          thrax::label(&arg,tree,(Span)((uint)uVar1 | (int)nt_00 << 0x10));
          if (arg.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged != false) {
            label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
            _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
            _M_payload._M_value.label._M_len = (pNVar7->label)._M_len;
            arg.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_str = (pNVar7->label)._M_str;
            label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
            _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
            _16_8_ = arg.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_payload._M_value._M_len;
            lStack_100 = 2;
            arg.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len =
                 label.
                 super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
                 _M_payload.
                 super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
                 _M_payload._M_value.label._M_len;
            arg.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _16_8_ = label.
                     super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
                     _16_8_;
            label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
            _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
            _M_payload._M_value.label._M_str =
                 arg.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_str;
            goto LAB_00136a72;
          }
        }
      }
      anon_unknown_0::concatenation
                ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)&label,tree,nt_00);
      if (local_78 == true) {
        lStack_100 = 3;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len =
             label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
             _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
             ._M_payload._M_value.label._M_len;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str =
             label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
             _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
             ._M_payload._M_value.label._M_str;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_
             = label.
               super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
               _M_payload.
               super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>._16_8_;
      }
      else {
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._0_2_ = nt_00.start;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._2_2_ = nt_00.end;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = (char *)0x0;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged = false;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._17_7_
             = 0;
        pVar10 = std::
                 equal_range<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,jhu::thrax::(anonymous_namespace)::__1>
                           ((this->tree_).
                            super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (this->tree_).
                            super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (optional<jhu::thrax::(anonymous_namespace)::Concat> *)&arg);
        for (_Var4 = pVar10.first._M_current; _Var4._M_current < pVar10.second._M_current._M_current
            ; _Var4._M_current = _Var4._M_current + 1) {
          anon_unknown_0::concatenation
                    ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)&arg,tree,
                     (Span)((uint)(ushort)((_Var4._M_current)->span).end | (uint)nt_00 & 0xffff0000)
                    );
          if ((bool)local_c8 != false) {
            label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
            _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
            _M_payload._M_value.label._M_len = ((_Var4._M_current)->label)._M_len;
            arg.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_str = ((_Var4._M_current)->label)._M_str;
            label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
            _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
            _16_8_ = arg.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_payload._M_value._M_len;
            arg.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _16_8_ = arg.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_payload._M_value._M_len;
            lStack_100 = 4;
            arg.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len =
                 label.
                 super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
                 _M_payload.
                 super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
                 _M_payload._M_value.label._M_len;
            label.super__Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>.
            _M_payload.super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
            _M_payload._M_value.label._M_str =
                 arg.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_str;
            goto LAB_00136a72;
          }
        }
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len = 1;
        arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = "X";
        lStack_100 = 0;
      }
    }
LAB_00136a72:
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_jhu::thrax::(anonymous_namespace)::LabelVisitor_&&,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_&&>
      ::_S_vtable._M_arr[lStack_100]._M_data)
              (&result,(LabelVisitor *)&label,
               (variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>
                *)&arg);
    arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._0_2_ = nt_00.start;
    arg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._2_2_ = nt_00.end;
    this_00 = (string *)
              ((long)&arg.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._M_payload + 8);
    std::__cxx11::string::string(this_00,(string *)&result);
    iVar5 = std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::
            _M_insert_rval(&this->cache_,__position._M_current,(value_type *)&arg);
    pcVar6 = ((iVar5._M_current)->label)._M_dataplus._M_p;
    sVar9 = ((iVar5._M_current)->label)._M_string_length;
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    pcVar6 = ((__position._M_current)->label)._M_dataplus._M_p;
    sVar9 = ((__position._M_current)->label)._M_string_length;
  }
  sVar12._M_str = pcVar6;
  sVar12._M_len = sVar9;
  return sVar12;
}

Assistant:

std::string_view SAMTLabeler::operator()(SpanPair nt) const {
  key_.span = nt.tgt;
  auto it = std::lower_bound(cache_.begin(), cache_.end(), key_, spanOrder);
  if (it != cache_.end() && it->span == nt.tgt) {
    return it->label;
  }
  auto result = std::visit(LabelVisitor{}, label(tree_, nt));
  return cache_.insert(it, CachedLabel{ nt.tgt, result })->label;
}